

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_HexStr::test_method(util_HexStr *this)

{
  Span<const_std::byte> s;
  Span<const_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  Span<const_unsigned_char> s_04;
  Span<const_unsigned_char> s_05;
  bool bVar1;
  lazy_ostream *plVar2;
  long in_FS_OFFSET;
  size_t i;
  size_type lower;
  size_type upper;
  size_t i_1;
  Span<const_std::byte> in_b;
  Span<const_unsigned_char> in_u;
  span<const_unsigned_char,_18446744073709551615UL> in_s;
  string_view out_exp;
  string hex;
  string input;
  char *in_stack_fffffffffffff7e8;
  undefined1 *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff800;
  char in_stack_fffffffffffff80f;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff820;
  undefined7 in_stack_fffffffffffff828;
  char in_stack_fffffffffffff82f;
  uchar *in_stack_fffffffffffff870;
  size_t in_stack_fffffffffffff878;
  ulong uVar3;
  const_string local_628 [2];
  lazy_ostream local_608 [2];
  long local_5e8;
  assertion_result local_5c0 [2];
  const_string local_588 [2];
  lazy_ostream local_568 [4];
  assertion_result local_528 [2];
  const_string local_4f0 [2];
  lazy_ostream local_4d0 [4];
  assertion_result local_490 [2];
  size_type local_458;
  size_type local_450;
  ulong local_448;
  const_string local_440 [2];
  lazy_ostream local_420 [2];
  undefined4 local_3fc;
  size_type local_3f8;
  assertion_result local_3e0 [3];
  byte *local_398;
  size_t sStack_390;
  undefined1 local_388 [16];
  undefined1 local_378 [80];
  undefined1 local_328 [16];
  undefined1 local_318 [64];
  uchar *local_2d8;
  size_t sStack_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [64];
  Span<const_std::byte> local_278;
  Span<const_unsigned_char> local_268;
  undefined1 *local_258;
  undefined8 local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [16];
  undefined1 local_218 [80];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [80];
  undefined1 local_168 [16];
  undefined1 local_158 [144];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,(char (*) [1])in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    Span<const_unsigned_char>::Span<65>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff7e8,(uchar (*) [65])0xc0b97a);
    s_01.m_size = in_stack_fffffffffffff878;
    s_01.m_data = in_stack_fffffffffffff870;
    HexStr_abi_cxx11_(s_01);
    in_stack_fffffffffffff7f8 = "HEX_PARSE_INPUT";
    in_stack_fffffffffffff7f0 = HEX_PARSE_INPUT;
    in_stack_fffffffffffff7e8 = "HexStr(HEX_PARSE_OUTPUT)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[131]>
              (local_158,local_168,0xed,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,(char (*) [1])in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    Span<const_unsigned_char>::Span<65>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff7e8,(uchar (*) [65])0xc0bae2);
    Span<const_unsigned_char>::last
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff7f8,
               (size_t)in_stack_fffffffffffff7f0);
    s_02.m_size = in_stack_fffffffffffff878;
    s_02.m_data = in_stack_fffffffffffff870;
    HexStr_abi_cxx11_(s_02);
    in_stack_fffffffffffff7f8 = "\"\"";
    in_stack_fffffffffffff7f0 = "";
    in_stack_fffffffffffff7e8 = "HexStr(Span{HEX_PARSE_OUTPUT}.last(0))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_1b8,local_1c8,0xee,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,(char (*) [1])in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    Span<const_unsigned_char>::Span<65>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff7e8,(uchar (*) [65])0xc0bc6b);
    Span<const_unsigned_char>::first
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff7f8,
               (size_t)in_stack_fffffffffffff7f0);
    s_03.m_size = in_stack_fffffffffffff878;
    s_03.m_data = in_stack_fffffffffffff870;
    HexStr_abi_cxx11_(s_03);
    in_stack_fffffffffffff7f8 = "\"\"";
    in_stack_fffffffffffff7f0 = "";
    in_stack_fffffffffffff7e8 = "HexStr(Span{HEX_PARSE_OUTPUT}.first(0))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_218,local_228,0xef,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_248._M_dataplus._M_p = (pointer)0xa;
  local_248._M_string_length = 0x1cca7ee;
  local_258 = HEX_PARSE_OUTPUT;
  local_250 = 5;
  local_268 = MakeUCharSpan<std::span<unsigned_char_const,18446744073709551615ul>const&>
                        ((span<const_unsigned_char,_18446744073709551615UL> *)
                         in_stack_fffffffffffff7f8);
  local_278 = MakeByteSpan<std::span<unsigned_char_const,18446744073709551615ul>const&>
                        ((span<const_unsigned_char,_18446744073709551615UL> *)
                         in_stack_fffffffffffff7f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,(char (*) [1])in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    local_2d8 = local_268.m_data;
    sStack_2d0 = local_268.m_size;
    s_04.m_size = in_stack_fffffffffffff878;
    s_04.m_data = in_stack_fffffffffffff870;
    HexStr_abi_cxx11_(s_04);
    in_stack_fffffffffffff7f8 = "out_exp";
    in_stack_fffffffffffff7f0 = (undefined1 *)&local_248;
    in_stack_fffffffffffff7e8 = "HexStr(in_u)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (local_2b8,local_2c8,0xf7,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,(char (*) [1])in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    Span<unsigned_char_const>::Span<std::span<unsigned_char_const,18446744073709551615ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff7f8,
               (span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff7f0,
               in_stack_fffffffffffff7e8);
    s_05.m_size = in_stack_fffffffffffff878;
    s_05.m_data = in_stack_fffffffffffff870;
    HexStr_abi_cxx11_(s_05);
    in_stack_fffffffffffff7f8 = "out_exp";
    in_stack_fffffffffffff7f0 = (undefined1 *)&local_248;
    in_stack_fffffffffffff7e8 = "HexStr(in_s)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (local_318,local_328,0xf8,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,(char (*) [1])in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    local_398 = local_278.m_data;
    sStack_390 = local_278.m_size;
    s.m_data._7_1_ = in_stack_fffffffffffff817;
    s.m_data._0_7_ = in_stack_fffffffffffff810;
    s.m_size._0_7_ = in_stack_fffffffffffff818;
    s.m_size._7_1_ = in_stack_fffffffffffff81f;
    HexStr_abi_cxx11_(s);
    in_stack_fffffffffffff7f8 = "out_exp";
    in_stack_fffffffffffff7f0 = (undefined1 *)&local_248;
    in_stack_fffffffffffff7e8 = "HexStr(in_b)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (local_378,local_388,0xf9,1,2,local_c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::string(in_stack_fffffffffffff800);
  for (uVar3 = 0; uVar3 < 0x100; uVar3 = uVar3 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffff800,in_stack_fffffffffffff80f);
  }
  Span<char_const>::Span<std::__cxx11::string>
            ((Span<const_char> *)in_stack_fffffffffffff7f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  s_00.m_data._7_1_ = in_stack_fffffffffffff817;
  s_00.m_data._0_7_ = in_stack_fffffffffffff810;
  s_00.m_size._0_7_ = in_stack_fffffffffffff818;
  s_00.m_size._7_1_ = in_stack_fffffffffffff81f;
  HexStr_abi_cxx11_(s_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
               (const_string *)in_stack_fffffffffffff820,
               CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
               (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    local_3f8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
    local_3fc = 0x200;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                *)in_stack_fffffffffffff7f0,(int *)in_stack_fffffffffffff7e8);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
                *)in_stack_fffffffffffff820,(bool)in_stack_fffffffffffff81f);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (unsigned_long)in_stack_fffffffffffff7e8);
    in_stack_fffffffffffff7e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e0,local_420,local_440,0x103,REQUIRE,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_448 = 0; local_448 < 0x100; local_448 = local_448 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7f8,(size_type)in_stack_fffffffffffff7f0);
    local_450 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (in_stack_fffffffffffff820,in_stack_fffffffffffff82f,
                           CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7f8,(size_type)in_stack_fffffffffffff7f0);
    local_458 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (in_stack_fffffffffffff820,in_stack_fffffffffffff82f,
                           CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
                 (const_string *)in_stack_fffffffffffff820,
                 CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                 (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
      operator!=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                  *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
                  *)in_stack_fffffffffffff820,(bool)in_stack_fffffffffffff81f);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff7f0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff7e8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_490,local_4d0,local_4f0,0x108,REQUIRE,CHECK_BUILT_ASSERTION);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7e8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
                 (const_string *)in_stack_fffffffffffff820,
                 CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                 (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
      operator!=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                  *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
                  *)in_stack_fffffffffffff820,(bool)in_stack_fffffffffffff81f);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff7f0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff7e8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_528,local_568,local_588,0x109,REQUIRE,CHECK_BUILT_ASSERTION);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff82f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff82f);
    do {
      in_stack_fffffffffffff820 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828),
                 (const_string *)in_stack_fffffffffffff820,
                 CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                 (const_string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
      local_5e8 = local_450 * 0x10 + local_458;
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
      operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                  *)in_stack_fffffffffffff7f0,(unsigned_long *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                  *)in_stack_fffffffffffff820,(bool)in_stack_fffffffffffff81f);
      plVar2 = boost::unit_test::lazy_ostream::instance();
      in_stack_fffffffffffff818 = SUB87(plVar2,0);
      in_stack_fffffffffffff81f = (undefined1)((ulong)plVar2 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff7f0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff7e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                 (unsigned_long)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff7e8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_5c0,local_608,local_628,0x10a,REQUIRE,CHECK_BUILT_ASSERTION);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7e8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff817 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff817);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_HexStr)
{
    BOOST_CHECK_EQUAL(HexStr(HEX_PARSE_OUTPUT), HEX_PARSE_INPUT);
    BOOST_CHECK_EQUAL(HexStr(Span{HEX_PARSE_OUTPUT}.last(0)), "");
    BOOST_CHECK_EQUAL(HexStr(Span{HEX_PARSE_OUTPUT}.first(0)), "");

    {
        constexpr std::string_view out_exp{"04678afdb0"};
        constexpr std::span in_s{HEX_PARSE_OUTPUT, out_exp.size() / 2};
        const Span<const uint8_t> in_u{MakeUCharSpan(in_s)};
        const Span<const std::byte> in_b{MakeByteSpan(in_s)};

        BOOST_CHECK_EQUAL(HexStr(in_u), out_exp);
        BOOST_CHECK_EQUAL(HexStr(in_s), out_exp);
        BOOST_CHECK_EQUAL(HexStr(in_b), out_exp);
    }

    {
        auto input = std::string();
        for (size_t i=0; i<256; ++i) {
            input.push_back(static_cast<char>(i));
        }

        auto hex = HexStr(input);
        BOOST_TEST_REQUIRE(hex.size() == 512);
        static constexpr auto hexmap = std::string_view("0123456789abcdef");
        for (size_t i = 0; i < 256; ++i) {
            auto upper = hexmap.find(hex[i * 2]);
            auto lower = hexmap.find(hex[i * 2 + 1]);
            BOOST_TEST_REQUIRE(upper != std::string_view::npos);
            BOOST_TEST_REQUIRE(lower != std::string_view::npos);
            BOOST_TEST_REQUIRE(i == upper*16 + lower);
        }
    }
}